

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_get_color_profile
               (LodePNGColorProfile *profile,uchar *in,uint w,uint h,LodePNGColorMode *mode)

{
  LodePNGColorType LVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  byte bVar11;
  ulong in_R11;
  undefined7 uVar12;
  size_t sVar13;
  size_t sVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  unsigned_short b;
  unsigned_short g;
  unsigned_short r;
  unsigned_short a;
  ColorTree tree;
  unsigned_short local_110;
  unsigned_short local_10e;
  unsigned_short local_10c;
  unsigned_short local_10a;
  uint local_108;
  byte local_101;
  byte local_100;
  byte local_ff;
  byte local_fe;
  byte local_fd;
  int local_fc;
  uint local_f8;
  uint local_f4;
  uchar *local_f0;
  uint local_e8;
  uint local_e4;
  uint local_e0;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  size_t local_d0;
  LodePNGColorMode *local_c8;
  LodePNGColorProfile *local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  int local_38;
  
  LVar1 = mode->colortype;
  local_fc = 0;
  local_f0 = in;
  local_108 = lodepng_can_have_alpha(mode);
  iVar8 = 0;
  if ((ulong)LVar1 < 7) {
    iVar8 = *(int *)(&DAT_0023e280 + (ulong)LVar1 * 4);
  }
  sVar14 = (size_t)(h * w);
  uVar10 = iVar8 * mode->bitdepth;
  local_101 = uVar10 == 1;
  local_f8 = 2;
  if (8 < uVar10) {
    local_f8 = 0x101;
  }
  if ((8 >= uVar10 && !(bool)local_101) && (local_f8 = 4, uVar10 != 2)) {
    local_f8 = 0x100;
    if (uVar10 == 4) {
      local_f8 = 0x10;
    }
  }
  local_108 = local_108 ^ 1;
  local_fc = CONCAT31((int3)((uint)local_fc >> 8),(LVar1 & ~LCT_GREY_ALPHA) == LCT_GREY);
  local_48 = (undefined1  [16])0x0;
  local_58 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  local_b8 = (undefined1  [16])0x0;
  local_38 = -1;
  if ((mode->bitdepth == 0x10) && (sVar14 != 0)) {
    sVar13 = 0;
    do {
      getPixelColorRGBA16(&local_10c,&local_10e,&local_110,&local_10a,local_f0,sVar13,mode);
      if (((((local_10c & 0xff) != local_10c >> 8) || ((local_10e & 0xff) != local_10e >> 8)) ||
          ((local_110 & 0xff) != local_110 >> 8)) || ((local_10a & 0xff) != local_10a >> 8)) {
        sVar13 = 0;
        local_10c = 0;
        local_10e = 0;
        local_110 = 0;
        local_10a = 0;
        profile->bits = 0x10;
        iVar8 = local_fc;
        goto LAB_001a8152;
      }
      sVar13 = sVar13 + 1;
    } while (sVar14 != sVar13);
  }
  if (sVar14 != 0) {
    sVar13 = 0;
    bVar2 = false;
    local_f4 = uVar10;
    local_d0 = sVar14;
    local_c8 = mode;
    local_c0 = profile;
    do {
      uVar7 = local_f4;
      local_10c = local_10c & 0xff00;
      local_10e = local_10e & 0xff00;
      local_110 = local_110 & 0xff00;
      local_10a = local_10a & 0xff00;
      getPixelColorRGBA8((uchar *)&local_10c,(uchar *)&local_10e,(uchar *)&local_110,
                         (uchar *)&local_10a,local_f0,sVar13,mode);
      uVar10 = profile->bits;
      bVar11 = (byte)local_10c;
      if (uVar10 < 8 && (local_101 & 1) == 0) {
        uVar6 = 1;
        if ((1 < (byte)((byte)local_10c + 1)) && (uVar6 = 8, (byte)((byte)local_10c * -0xf) < 0x10))
        {
          uVar6 = (uint)(3 < (byte)((byte)local_10c * -3)) * 2 + 2;
        }
        if (uVar10 < uVar6) {
          profile->bits = uVar6;
          uVar10 = uVar6;
        }
      }
      local_101 = uVar7 <= uVar10;
      uVar9 = CONCAT71((uint7)(uint3)(uVar7 >> 8),1);
      in_R11 = CONCAT71((int7)(in_R11 >> 8),1);
      bVar15 = local_fc == 0;
      local_fc = 1;
      bVar4 = (byte)local_10e;
      bVar3 = (byte)local_110;
      uVar7 = uVar10;
      if (bVar15) {
        if ((byte)local_10c == (byte)local_10e) {
          in_R11 = 0;
          local_fc = 0;
          if ((byte)local_10c == (byte)local_110) goto LAB_001a7e91;
        }
        profile->colored = 1;
        uVar12 = (undefined7)(in_R11 >> 8);
        in_R11 = CONCAT71(uVar12,1);
        local_fc = 1;
        if (uVar10 < 8) {
          profile->bits = 8;
          uVar7 = 8;
          in_R11 = CONCAT71(uVar12,1);
        }
      }
LAB_001a7e91:
      bVar5 = (byte)local_10a;
      if (local_108 == 0) {
        if ((profile->key_r == (local_10c & 0xff)) && (profile->key_g == (local_10e & 0xff))) {
          bVar15 = profile->key_b == (local_110 & 0xff);
        }
        else {
          bVar15 = false;
        }
        if ((byte)local_10a == 0xff) {
          uVar9 = 0;
          local_108 = 0;
          if ((bool)(profile->key != 0 & bVar15)) {
            profile->alpha = 1;
            if (uVar7 < 8) goto LAB_001a80c3;
            goto LAB_001a7e98;
          }
        }
        else {
          if (((byte)local_10a != 0) || (!(bool)(profile->key == 0 | bVar15))) {
            profile->alpha = 1;
            if (uVar7 < 8) {
LAB_001a80c3:
              profile->bits = 8;
              goto LAB_001a7e98;
            }
            goto LAB_001a7e9b;
          }
          uVar9 = 0;
          local_108 = 0;
          if (profile->key == 0 && profile->alpha == 0) {
            profile->key = 1;
            profile->key_r = local_10c & 0xff;
            profile->key_g = local_10e & 0xff;
            profile->key_b = local_110 & 0xff;
            uVar9 = 0;
            local_108 = 0;
          }
        }
      }
      else {
LAB_001a7e98:
        uVar9 = CONCAT71((int7)(uVar9 >> 8),1);
LAB_001a7e9b:
        local_108 = 1;
      }
      bVar15 = true;
      if (bVar2) {
LAB_001a7eb1:
        bVar2 = bVar15;
        bVar11 = (byte)in_R11 & (byte)uVar9 & bVar2;
        in_R11 = CONCAT71((int7)(in_R11 >> 8),bVar11);
        if ((bVar11 == 1) && (local_f4 <= uVar10)) break;
      }
      else {
        local_dc = (uint)uVar9;
        local_d8 = (uint)in_R11;
        local_e0 = (uint)(byte)local_10e;
        local_e4 = (uint)(byte)local_110;
        local_e8 = (uint)(byte)local_10a;
        local_d4 = uVar10;
        iVar8 = color_tree_get((ColorTree *)local_b8,(byte)local_10c,(byte)local_10e,(byte)local_110
                               ,(byte)local_10a);
        profile = local_c0;
        if (iVar8 < 0) {
          local_100 = bVar11;
          local_ff = bVar5;
          local_fe = bVar3;
          local_fd = bVar4;
          color_tree_add((ColorTree *)local_b8,bVar11,(uchar)local_e0,(uchar)local_e4,
                         (uchar)local_e8,local_c0->numcolors);
          uVar7 = profile->numcolors;
          if ((ulong)uVar7 < 0x100) {
            uVar9 = (ulong)(uVar7 * 4);
            profile->palette[(ulong)uVar7 * 4] = local_100;
            profile->palette[uVar9 + 1] = local_fd;
            profile->palette[uVar9 + 2] = local_fe;
            profile->palette[uVar9 + 3] = local_ff;
          }
          profile->numcolors = uVar7 + 1;
          in_R11 = (ulong)local_d8;
          uVar9 = (ulong)local_dc;
          mode = local_c8;
          sVar14 = local_d0;
          uVar10 = local_d4;
          bVar15 = local_f8 <= uVar7 + 1;
          goto LAB_001a7eb1;
        }
        bVar2 = false;
        mode = local_c8;
        sVar14 = local_d0;
      }
      sVar13 = sVar13 + 1;
    } while (sVar14 != sVar13);
  }
  uVar10._0_2_ = profile->key_r;
  uVar10._2_2_ = profile->key_g;
  auVar16 = psllw(ZEXT416(uVar10),8);
  profile->key_r = auVar16._0_2_ + (undefined2)uVar10;
  profile->key_g = auVar16._2_2_ + uVar10._2_2_;
  profile->key_b = (short)(*(int *)&profile->key_b << 8) + (short)*(int *)&profile->key_b;
LAB_001a80fc:
  color_tree_cleanup((ColorTree *)local_b8);
  return 0;
  while (sVar13 = sVar13 + 1, sVar14 != sVar13) {
LAB_001a8152:
    getPixelColorRGBA16(&local_10c,&local_10e,&local_110,&local_10a,local_f0,sVar13,mode);
    bVar2 = true;
    bVar15 = iVar8 == 0;
    iVar8 = 1;
    if (bVar15) {
      if (local_10c == local_10e) {
        bVar2 = false;
        iVar8 = 0;
        if (local_10c == local_110) goto LAB_001a81ae;
      }
      profile->colored = 1;
      bVar2 = true;
      iVar8 = 1;
    }
LAB_001a81ae:
    if (local_108 == 0) {
      if ((local_10c == profile->key_r) && (local_10e == profile->key_g)) {
        bVar15 = local_110 == profile->key_b;
      }
      else {
        bVar15 = false;
      }
      if (local_10a == 0xffff) {
        local_108 = 0;
        if ((bool)(profile->key != 0 & bVar15)) goto LAB_001a824e;
      }
      else {
        if ((local_10a != 0) || (!(bool)(profile->key == 0 | bVar15))) {
LAB_001a824e:
          profile->alpha = 1;
          goto LAB_001a8256;
        }
        local_108 = 0;
        if (profile->key == 0 && profile->alpha == 0) {
          profile->key = 1;
          profile->key_r = local_10c;
          profile->key_g = local_10e;
          profile->key_b = local_110;
        }
      }
    }
    else {
LAB_001a8256:
      local_108 = 1;
      if (bVar2) break;
    }
  }
  goto LAB_001a80fc;
}

Assistant:

unsigned lodepng_get_color_profile(LodePNGColorProfile* profile,
                                   const unsigned char* in, unsigned w, unsigned h,
                                   const LodePNGColorMode* mode)
{
  unsigned error = 0;
  size_t i;
  ColorTree tree;
  size_t numpixels = w * h;

  unsigned colored_done = lodepng_is_greyscale_type(mode) ? 1 : 0;
  unsigned alpha_done = lodepng_can_have_alpha(mode) ? 0 : 1;
  unsigned numcolors_done = 0;
  unsigned bpp = lodepng_get_bpp(mode);
  unsigned bits_done = bpp == 1 ? 1 : 0;
  unsigned maxnumcolors = 257;
  unsigned sixteen = 0;
  if(bpp <= 8) maxnumcolors = bpp == 1 ? 2 : (bpp == 2 ? 4 : (bpp == 4 ? 16 : 256));

  color_tree_init(&tree);

  /*Check if the 16-bit input is truly 16-bit*/
  if(mode->bitdepth == 16)
  {
    unsigned short r, g, b, a;
    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode);
      if((r & 255) != ((r >> 8) & 255) || (g & 255) != ((g >> 8) & 255) ||
         (b & 255) != ((b >> 8) & 255) || (a & 255) != ((a >> 8) & 255)) /*first and second byte differ*/
      {
        sixteen = 1;
        break;
      }
    }
  }

  if(sixteen)
  {
    unsigned short r = 0, g = 0, b = 0, a = 0;
    profile->bits = 16;
    bits_done = numcolors_done = 1; /*counting colors no longer useful, palette doesn't support 16-bit*/

    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode);

      if(!colored_done && (r != g || r != b))
      {
        profile->colored = 1;
        colored_done = 1;
      }

      if(!alpha_done)
      {
        unsigned matchkey = (r == profile->key_r && g == profile->key_g && b == profile->key_b);
        if(a != 65535 && (a != 0 || (profile->key && !matchkey)))
        {
          profile->alpha = 1;
          alpha_done = 1;
          if(profile->bits < 8) profile->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
        else if(a == 0 && !profile->alpha && !profile->key)
        {
          profile->key = 1;
          profile->key_r = r;
          profile->key_g = g;
          profile->key_b = b;
        }
        else if(a == 65535 && profile->key && matchkey)
        {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          profile->alpha = 1;
          alpha_done = 1;
        }
      }

      if(alpha_done && numcolors_done && colored_done && bits_done) break;
    }
  }
  else /* < 16-bit */
  {
    for(i = 0; i != numpixels; ++i)
    {
      unsigned char r = 0, g = 0, b = 0, a = 0;
      getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode);

      if(!bits_done && profile->bits < 8)
      {
        /*only r is checked, < 8 bits is only relevant for greyscale*/
        unsigned bits = getValueRequiredBits(r);
        if(bits > profile->bits) profile->bits = bits;
      }
      bits_done = (profile->bits >= bpp);

      if(!colored_done && (r != g || r != b))
      {
        profile->colored = 1;
        colored_done = 1;
        if(profile->bits < 8) profile->bits = 8; /*PNG has no colored modes with less than 8-bit per channel*/
      }

      if(!alpha_done)
      {
        unsigned matchkey = (r == profile->key_r && g == profile->key_g && b == profile->key_b);
        if(a != 255 && (a != 0 || (profile->key && !matchkey)))
        {
          profile->alpha = 1;
          alpha_done = 1;
          if(profile->bits < 8) profile->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
        else if(a == 0 && !profile->alpha && !profile->key)
        {
          profile->key = 1;
          profile->key_r = r;
          profile->key_g = g;
          profile->key_b = b;
        }
        else if(a == 255 && profile->key && matchkey)
        {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          profile->alpha = 1;
          alpha_done = 1;
          if(profile->bits < 8) profile->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
      }

      if(!numcolors_done)
      {
        if(!color_tree_has(&tree, r, g, b, a))
        {
          color_tree_add(&tree, r, g, b, a, profile->numcolors);
          if(profile->numcolors < 256)
          {
            unsigned char* p = profile->palette;
            unsigned n = profile->numcolors;
            p[n * 4 + 0] = r;
            p[n * 4 + 1] = g;
            p[n * 4 + 2] = b;
            p[n * 4 + 3] = a;
          }
          ++profile->numcolors;
          numcolors_done = profile->numcolors >= maxnumcolors;
        }
      }

      if(alpha_done && numcolors_done && colored_done && bits_done) break;
    }

    /*make the profile's key always 16-bit for consistency - repeat each byte twice*/
    profile->key_r += (profile->key_r << 8);
    profile->key_g += (profile->key_g << 8);
    profile->key_b += (profile->key_b << 8);
  }

  color_tree_cleanup(&tree);
  return error;
}